

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

void synchronize(void)

{
  int iVar1;
  
  step = step + 1;
  uv_cond_signal(&condvar);
  iVar1 = step;
  do {
    uv_cond_wait(&condvar,&mutex);
  } while (iVar1 == step);
  if (step == iVar1 + 1) {
    return;
  }
  synchronize_cold_1();
  return;
}

Assistant:

static void synchronize(void) {
  int current;

  synchronize_nowait();
  /* Wait for the other thread.  Guard against spurious wakeups. */
  for (current = step; current == step; uv_cond_wait(&condvar, &mutex));
  ASSERT(step == current + 1);
}